

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Integer ma_max_heap_frag_nelem(Integer datatype,Integer min_nelem)

{
  Pointer address;
  Pointer datatype_00;
  long in_RSI;
  long in_RDI;
  Integer max_nelem;
  Integer nelem;
  ulongi nbytes;
  AD *ad;
  ulongi min_bytes;
  Integer local_40;
  long local_38;
  _AD *length;
  
  address = (Pointer)(in_RSI * ma_sizeof[in_RDI] + 0x58);
  local_38 = 0;
  for (length = ma_hfree; length != (AD *)0x0; length = length->next) {
    if (length < ma_partition) {
      if (length->name + (length->nbytes - 0x10) < ma_partition) {
        datatype_00 = (Pointer)length->nbytes;
      }
      else {
        datatype_00 = ma_partition + -(long)length;
      }
      if (address <= datatype_00) {
        local_40 = ma_nelem(address,(ulongi)length,(Integer)datatype_00);
        if (local_40 <= local_38) {
          local_40 = local_38;
        }
        local_38 = local_40;
      }
    }
  }
  return local_38;
}

Assistant:

private Integer ma_max_heap_frag_nelem(datatype, min_nelem)
    Integer    datatype;    /* of elements */
    Integer    min_nelem;    /* for fragment to be considered */
{
    ulongi    min_bytes;    /* for fragment to be considered */
    AD        *ad;        /* traversal pointer */
    ulongi    nbytes;        /* in current fragment */
    Integer    nelem;        /* in current fragment */
    Integer    max_nelem;    /* result */

    /* set the threshold */
    min_bytes = (min_nelem * ma_sizeof[datatype]) + BLOCK_OVERHEAD_FIXED;

    /* search the heap free list */
    max_nelem = 0;
    for (ad = ma_hfree; ad; ad = ad->next)
    {
        /*
         * There are 3 cases to consider:
         *
         * (a) fragment is outside heap region
         * (b) fragment straddles partition between heap and stack regions
         * (c) fragment is inside heap region
         */

        if ((Pointer)ad >= ma_partition)
        {
            /* case (a): reject */
            continue;
        }
        else if (((Pointer)ad + ad->nbytes) >= ma_partition)
        {
            /* case (b): truncate fragment at partition */
            nbytes = (ulongi)(ma_partition - (Pointer)ad);
        }
        else
        {
            /* case (c): accept */
            nbytes = ad->nbytes;
        }

        if (nbytes >= min_bytes)
        {
            nelem = ma_nelem((Pointer)ad, nbytes, datatype);
            max_nelem = max(max_nelem, nelem);
        }
    }

    /* return the result */
    return max_nelem;
}